

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void test(void)

{
  istream *piVar1;
  ostream *poVar2;
  long *plVar3;
  int iVar4;
  char c;
  int dist;
  int b;
  int a;
  int e;
  int n;
  char local_45;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  freopen("C:/Project/CLion/ShortestPathAlgorithmWithHeaps/data1.txt","r",_stdin);
  piVar1 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_34);
  std::istream::operator>>(piVar1,&local_38);
  iVar4 = 100;
  do {
    piVar1 = std::operator>>((istream *)&std::cin,&local_45);
    piVar1 = (istream *)std::istream::operator>>(piVar1,&local_3c);
    piVar1 = (istream *)std::istream::operator>>(piVar1,&local_40);
    std::istream::operator>>(piVar1,&local_44);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_3c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_40);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    plVar3 = (long *)std::ostream::operator<<(poVar2,local_44);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  return;
}

Assistant:

void test() {
    int a, b, dist;
    int n, e;
    char c;
    freopen("C:/Project/CLion/ShortestPathAlgorithmWithHeaps/data1.txt", "r", stdin);
    cin >> n >> e;
    for (int i = 0; i < 100; i++) {
        cin >> c >> a >> b >> dist;
        cout << a << " " << b << " " << dist << endl;
    }

}